

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O1

void __thiscall pmx::PmxFrame::Read(PmxFrame *this,istream *stream,PmxSetting *setting)

{
  PmxFrameElement *pPVar1;
  uint8_t in_CL;
  PmxFrameElement *pPVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  string local_48;
  
  ReadString_abi_cxx11_(&local_48,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_48,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->frame_english_name,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)&this->frame_flag);
  std::istream::read((char *)stream,(long)&this->element_count);
  lVar4 = (long)this->element_count;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 8;
  }
  pPVar1 = (PmxFrameElement *)operator_new__(uVar3);
  if (lVar4 != 0) {
    pPVar2 = pPVar1;
    do {
      pPVar2->element_target = '\0';
      pPVar2->index = 0;
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1 + lVar4);
  }
  pPVar2 = (this->elements)._M_t.
           super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>
           .super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl;
  (this->elements)._M_t.
  super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>.
  super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl = pPVar1;
  if (pPVar2 != (PmxFrameElement *)0x0) {
    operator_delete__(pPVar2);
  }
  if (0 < this->element_count) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      PmxFrameElement::Read
                ((PmxFrameElement *)
                 (&((this->elements)._M_t.
                    super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>
                    .super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl)->
                   element_target + lVar4),stream,setting);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 < this->element_count);
  }
  return;
}

Assistant:

void PmxFrame::Read(std::istream *stream, PmxSetting *setting)
	{
		this->frame_name = ReadString(stream, setting->encoding);
		this->frame_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &this->frame_flag, sizeof(uint8_t));
		stream->read((char*) &this->element_count, sizeof(int));
		this->elements = mmd::make_unique<PmxFrameElement []>(this->element_count);
		for (int i = 0; i < this->element_count; i++)
		{
			this->elements[i].Read(stream, setting);
		}
	}